

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_link(char *zSrc,char *zTarget,int is_sym)

{
  int iVar1;
  undefined4 local_20;
  int rc;
  int is_sym_local;
  char *zTarget_local;
  char *zSrc_local;
  
  if (is_sym == 0) {
    local_20 = link(zSrc,zTarget);
  }
  else {
    local_20 = symlink(zSrc,zTarget);
  }
  iVar1 = -1;
  if (local_20 == 0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int UnixVfs_link(const char *zSrc, const char *zTarget, int is_sym)
{
	int rc;
	if( is_sym ){
		/* Symbolic link */
		rc = symlink(zSrc, zTarget);
	}else{
		/* Hard link */
		rc = link(zSrc, zTarget);
	}
	return rc == 0 ? JX9_OK : -1;
}